

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_kfold_conv_knum_int_num(jit_State *J)

{
  double dVar1;
  double dVar2;
  int32_t k;
  lua_Number n;
  jit_State *J_local;
  TRef local_4;
  
  dVar1 = *(double *)&(J->fold).left[1].i;
  if ((((J->fold).ins.field_1.t.irt & 0x80) == 0) ||
     ((dVar2 = (double)(int)dVar1, dVar1 == dVar2 && (!NAN(dVar1) && !NAN(dVar2))))) {
    (J->fold).ins.i = (int)dVar1;
    local_4 = 2;
  }
  else {
    local_4 = 3;
  }
  return local_4;
}

Assistant:

LJFOLD(CONV KNUM IRCONV_INT_NUM)
LJFOLDF(kfold_conv_knum_int_num)
{
  lua_Number n = knumleft;
  int32_t k = lj_num2int(n);
  if (irt_isguard(fins->t) && n != (lua_Number)k) {
    /* We're about to create a guard which always fails, like CONV +1.5.
    ** Some pathological loops cause this during LICM, e.g.:
    **   local x,k,t = 0,1.5,{1,[1.5]=2}
    **   for i=1,200 do x = x+ t[k]; k = k == 1 and 1.5 or 1 end
    **   assert(x == 300)
    */
    return FAILFOLD;
  }
  return INTFOLD(k);
}